

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::_::ImmediatePromiseNode<bool>_> __thiscall
kj::heap<kj::_::ImmediatePromiseNode<bool>,bool>(kj *this,bool *params)

{
  ImmediatePromiseNode<bool> *this_00;
  bool *value;
  ImmediatePromiseNode<bool> *extraout_RDX;
  Own<kj::_::ImmediatePromiseNode<bool>_> OVar1;
  ExceptionOr<bool> local_180;
  NoInfer<bool> *local_18;
  bool *params_local;
  
  local_18 = params;
  params_local = (bool *)this;
  this_00 = (ImmediatePromiseNode<bool> *)operator_new(0x170);
  value = fwd<bool>(local_18);
  _::ExceptionOr<bool>::ExceptionOr(&local_180,value);
  _::ImmediatePromiseNode<bool>::ImmediatePromiseNode(this_00,&local_180);
  Own<kj::_::ImmediatePromiseNode<bool>_>::Own
            ((Own<kj::_::ImmediatePromiseNode<bool>_> *)this,this_00,
             (Disposer *)&_::HeapDisposer<kj::_::ImmediatePromiseNode<bool>>::instance);
  _::ExceptionOr<bool>::~ExceptionOr(&local_180);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}